

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void update_polygon_display(void)

{
  if ((ulong)(uint)currentMode < 4) {
    (*glad_glPolygonMode)(0x408,*(GLenum *)(&DAT_00128060 + (ulong)(uint)currentMode * 4));
    return;
  }
  return;
}

Assistant:

void update_polygon_display() {
    switch (currentMode) {
        case 0:
            glPolygonMode(GL_FRONT_AND_BACK, GL_LINE);
            break;
        case 1:
            glPolygonMode(GL_FRONT_AND_BACK, GL_POINT);
            break;
        case 2:
        case 3:
            glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
            break;
        default:;
    }
}